

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_pipe_recv(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  sfd_tran_pipe *p;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  _Var1 = nni_aio_start(aio,sfd_tran_pipe_recv_cancel,arg);
  if (_Var1) {
    nni_list_append((nni_list *)((long)arg + 0x70),aio);
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x70));
    if (pnVar2 == aio) {
      sfd_tran_pipe_recv_start((sfd_tran_pipe *)arg);
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  }
  return;
}

Assistant:

static void
sfd_tran_pipe_recv(void *arg, nni_aio *aio)
{
	sfd_tran_pipe *p = arg;

	nni_mtx_lock(&p->mtx);
	if (!nni_aio_start(aio, sfd_tran_pipe_recv_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}

	nni_list_append(&p->recvq, aio);
	if (nni_list_first(&p->recvq) == aio) {
		sfd_tran_pipe_recv_start(p);
	}
	nni_mtx_unlock(&p->mtx);
}